

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locator.cpp
# Opt level: O3

void __thiscall DSDcc::Locator::Locator(Locator *this,string *loc_string)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  long lVar4;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  if (loc_string->_M_string_length != 6) {
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    local_48 = local_38;
    pcVar1 = (loc_string->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + loc_string->_M_string_length);
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar3,local_48,local_48 + local_40);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  pcVar1 = (loc_string->_M_dataplus)._M_p;
  lVar4 = 0;
  do {
    iVar2 = toupper((int)pcVar1[lVar4]);
    pcVar1[lVar4] = (char)iVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  lVar4 = std::__cxx11::string::find('h',(ulong)(uint)(int)*(loc_string->_M_dataplus)._M_p);
  if (lVar4 == -1) {
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    local_68 = local_58;
    pcVar1 = (loc_string->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar1,pcVar1 + loc_string->_M_string_length);
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar3,local_68,local_68 + local_60);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  this->m_lon_index1 = (int)lVar4;
  lVar4 = std::__cxx11::string::find(-0x78,(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[1]);
  if (lVar4 == -1) {
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    local_88 = local_78;
    pcVar1 = (loc_string->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + loc_string->_M_string_length);
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar3,local_88,local_88 + local_80);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  this->m_lat_index1 = (int)lVar4;
  lVar4 = std::__cxx11::string::find(-0x58,(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[2]);
  if (lVar4 != -1) {
    this->m_lon_index2 = (int)lVar4;
    lVar4 = std::__cxx11::string::find(-0x38,(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[3]);
    if (lVar4 == -1) {
      psVar3 = (string *)__cxa_allocate_exception(0x20);
      local_c8 = local_b8;
      pcVar1 = (loc_string->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar1,pcVar1 + loc_string->_M_string_length);
      *(string **)psVar3 = psVar3 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar3,local_c8,local_c8 + local_c0);
      __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                  LocatorInvalidException::~LocatorInvalidException);
    }
    this->m_lat_index2 = (int)lVar4;
    lVar4 = std::__cxx11::string::find(-0x18,(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[4]);
    if (lVar4 != -1) {
      this->m_lon_index3 = (int)lVar4;
      lVar4 = std::__cxx11::string::find('\b',(ulong)(uint)(int)(loc_string->_M_dataplus)._M_p[5]);
      if (lVar4 != -1) {
        this->m_lat_index3 = (int)lVar4;
        this->m_lat = (float)this->m_lat_index2 + (float)this->m_lat_index1 * 10.0 + -90.0 +
                      (float)(int)lVar4 * 0.041666668 + 0.020833334;
        this->m_lon = (float)this->m_lon_index1 * 20.0 + -180.0 +
                      (float)this->m_lon_index2 + (float)this->m_lon_index2 +
                      (float)this->m_lon_index3 * 0.083333336 + 0.041666668;
        return;
      }
      psVar3 = (string *)__cxa_allocate_exception(0x20);
      local_108 = local_f8;
      pcVar1 = (loc_string->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar1,pcVar1 + loc_string->_M_string_length);
      *(string **)psVar3 = psVar3 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar3,local_108,local_108 + local_100);
      __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                  LocatorInvalidException::~LocatorInvalidException);
    }
    psVar3 = (string *)__cxa_allocate_exception(0x20);
    local_e8 = local_d8;
    pcVar1 = (loc_string->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar1,pcVar1 + loc_string->_M_string_length);
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar3,local_e8,local_e8 + local_e0);
    __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
                LocatorInvalidException::~LocatorInvalidException);
  }
  psVar3 = (string *)__cxa_allocate_exception(0x20);
  local_a8 = local_98;
  pcVar1 = (loc_string->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + loc_string->_M_string_length);
  *(string **)psVar3 = psVar3 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar3,local_a8,local_a8 + local_a0);
  __cxa_throw(psVar3,&LocatorInvalidException::typeinfo,
              LocatorInvalidException::~LocatorInvalidException);
}

Assistant:

Locator::Locator(std::string loc_string)
{
  // locator must be exactly 6 characters
  if (loc_string.length() != 6)
    throw LocatorInvalidException(loc_string);
  // convert to upper case
  std::transform(loc_string.begin(), loc_string.end(), loc_string.begin(), toupper);

  // retrieve latitude and longitude indexes

  std::string::size_type sz = m_lon_array1.find(loc_string[0]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index1 = sz;
  }

  sz = m_lat_array1.find(loc_string[1]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index1 = sz;
  }

  sz = m_lon_array2.find(loc_string[2]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index2 = sz;
  }

  sz = m_lat_array2.find(loc_string[3]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index2 = sz;
  }

  sz = m_lon_array3.find(loc_string[4]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lon_index3 = sz;
  }

  sz = m_lat_array3.find(loc_string[5]);

  if (sz == std::string::npos) {
      throw LocatorInvalidException(loc_string);
  } else {
      m_lat_index3 = sz;
  }

  // convert to decimal degrees for lower corner of locator square
  m_lat  = (m_lat_index1 * 10.0) - 90.0;
  m_lon  = (m_lon_index1 * 20.0) - 180.0;
  m_lat += m_lat_index2;
  m_lon += m_lon_index2 * 2.0;
  m_lat += m_lat_index3 / 24.0;
  m_lon += m_lon_index3 / 12.0;
  // adjust to center of locator square
  m_lat += 1.25 / 60.0;
  m_lon += 2.5 / 60.0;

}